

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O2

void __thiscall
license::test::generate_license_features::test_method(generate_license_features *this)

{
  bool bVar1;
  int iVar2;
  allocator local_241;
  allocator local_240 [8];
  undefined8 local_238;
  shared_count sStack_230;
  undefined1 local_228 [16];
  undefined1 auStack_218 [16];
  path licFile;
  string lic_location_str;
  undefined1 local_1c8 [24];
  char *local_1b0;
  _Rb_tree_node_base local_1a8;
  size_t local_188;
  _List_node_base local_180;
  undefined7 local_170;
  undefined4 uStack_169;
  bool local_165;
  int local_164;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  License license;
  
  boost::filesystem::path::path((path *)&license,"myclient2.lic");
  boost::filesystem::operator/(&licFile,(path *)MyGlobalFixture::licenses_path,(path *)&license);
  std::__cxx11::string::~string((string *)&license);
  std::__cxx11::string::string((string *)&lic_location_str,(string *)&licFile);
  License::License(&license,&lic_location_str,(string *)MyGlobalFixture::project_path,false);
  std::__cxx11::string::string((string *)local_1c8,"feature-names",local_240);
  std::__cxx11::string::string
            ((string *)local_228,"my_fantastic_softwAre,another_feature",&local_241);
  License::add_parameter(&license,(string *)local_1c8,(string *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)local_1c8);
  License::write_license(&license);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x76);
  bVar1 = boost::filesystem::exists(&licFile);
  local_228[0] = bVar1;
  local_228._8_8_ = 0;
  auStack_218._0_8_ = 0;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_0054cc88;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "license has been created";
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_f0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)auStack_218);
  local_1a8._M_left = &local_1a8;
  local_1a8._M_color = _S_red;
  local_1a8._M_parent = (_Base_ptr)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 0;
  local_188 = 0;
  local_180._M_next = &local_180;
  local_170 = 0;
  uStack_169 = 0;
  local_165 = true;
  local_164 = 0;
  local_1a8._M_right = local_1a8._M_left;
  local_180._M_prev = local_180._M_next;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8,
             licFile.m_pathname._M_dataplus._M_p);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x7a);
  iVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                    ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8,
                     "MY_FANTASTIC_SOFTWARE");
  local_240[0] = (allocator)(iVar2 == 2);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_228._0_8_ = &PTR__lazy_ostream_0054cd48;
  auStack_218._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_218._8_8_ = "Section [MY_FANTASTIC_SOFTWARE] has 2 elements";
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_230);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x7b);
  iVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                    ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8,
                     "ANOTHER_FEATURE");
  local_240[0] = (allocator)(iVar2 == 2);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_228._0_8_ = &PTR__lazy_ostream_0054cd88;
  auStack_218._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_218._8_8_ = "Section [ANOTHER_FEATURE] has 2 elements";
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_230);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8);
  License::~License(&license);
  std::__cxx11::string::~string((string *)&lic_location_str);
  std::__cxx11::string::~string((string *)&licFile);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generate_license_features) {
	const fs::path licFile = MyGlobalFixture::licenses_path / "myclient2.lic";
	const string lic_location_str = licFile.string();
	License license(&lic_location_str, MyGlobalFixture::project_path.string());
	license.add_parameter(PARAM_FEATURE_NAMES, "my_fantastic_softwAre,another_feature");
	license.write_license();
	BOOST_REQUIRE_MESSAGE(fs::exists(licFile), "license has been created");
	CSimpleIniA ini;
	ini.LoadFile(licFile.c_str());
	BOOST_CHECK_MESSAGE(ini.GetSectionSize("MY_FANTASTIC_SOFTWARE") == 2,
						"Section [MY_FANTASTIC_SOFTWARE] has 2 elements");
	BOOST_CHECK_MESSAGE(ini.GetSectionSize("ANOTHER_FEATURE") == 2, "Section [ANOTHER_FEATURE] has 2 elements");
}